

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.h
# Opt level: O0

Publisher __thiscall
miniros::NodeHandle::advertise<rosgraph_msgs::Clock_<std::allocator<void>>>
          (NodeHandle *this,string *topic,uint32_t queue_size,bool latch)

{
  undefined4 in_ECX;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SubscriberStatusCallback *in_RSI;
  AdvertiseOptions *in_RDI;
  byte in_R8B;
  Publisher PVar1;
  AdvertiseOptions ops;
  AdvertiseOptions *this_00;
  uint32_t _queue_size;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 local_108 [224];
  byte local_28;
  byte local_1d;
  undefined4 local_1c;
  string *local_18;
  
  local_1d = in_R8B & 1;
  _queue_size = (uint32_t)((ulong)local_108 >> 0x20);
  this_00 = in_RDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  AdvertiseOptions::AdvertiseOptions(in_RDI);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            ((function<void_(const_miniros::SingleSubscriberPublisher_&)> *)this_00);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            ((function<void_(const_miniros::SingleSubscriberPublisher_&)> *)this_00);
  AdvertiseOptions::init<rosgraph_msgs::Clock_<std::allocator<void>>>
            ((AdvertiseOptions *)CONCAT44(local_1c,in_stack_fffffffffffffe90),local_18,_queue_size,
             in_RSI,(SubscriberStatusCallback *)this_00);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::~function
            ((function<void_(const_miniros::SingleSubscriberPublisher_&)> *)0x1c2dbc);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::~function
            ((function<void_(const_miniros::SingleSubscriberPublisher_&)> *)0x1c2dc6);
  local_28 = local_1d & 1;
  miniros::NodeHandle::advertise(in_RDI);
  AdvertiseOptions::~AdvertiseOptions(this_00);
  PVar1.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar1.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  return (Publisher)
         PVar1.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Publisher advertise(const std::string& topic, uint32_t queue_size, bool latch = false)
    {
      AdvertiseOptions ops;
      ops.template init<M>(topic, queue_size);
      ops.latch = latch;
      return advertise(ops);
    }